

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallScriptGenerator.cxx
# Opt level: O0

string * __thiscall
cmInstallScriptGenerator::GetScript
          (string *__return_storage_ptr__,cmInstallScriptGenerator *this,string *config)

{
  cmLocalGenerator *lg;
  string *config_00;
  string local_98;
  string local_68;
  string local_48;
  undefined1 local_21;
  string *local_20;
  string *config_local;
  cmInstallScriptGenerator *this_local;
  string *script;
  
  local_21 = 0;
  local_20 = config;
  config_local = (string *)this;
  this_local = (cmInstallScriptGenerator *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (((this->AllowGenex & 1U) == 0) ||
     (((this->super_cmInstallGenerator).super_cmScriptGenerator.ActionsPerConfig & 1U) == 0)) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&this->Script);
  }
  else {
    std::__cxx11::string::string((string *)&local_68,(string *)&this->Script);
    config_00 = local_20;
    lg = this->LocalGenerator;
    std::__cxx11::string::string((string *)&local_98);
    cmGeneratorExpression::Evaluate
              (&local_48,&local_68,lg,config_00,(cmGeneratorTarget *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_98);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallScriptGenerator::GetScript(
  std::string const& config) const
{
  std::string script;
  if (this->AllowGenex && this->ActionsPerConfig) {
    script = cmGeneratorExpression::Evaluate(this->Script,
                                             this->LocalGenerator, config);
  } else {
    script = this->Script;
  }
  return script;
}